

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_add_rel_pos_impl
          (ggml_context *ctx,ggml_tensor *a,ggml_tensor *pw,ggml_tensor *ph,_Bool inplace)

{
  byte bVar1;
  _Bool _Var2;
  ggml_tensor *tensor;
  ggml_tensor *in_RCX;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  byte in_R8B;
  ggml_tensor *result;
  ggml_tensor *in_stack_ffffffffffffffc8;
  ggml_context *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  
  bVar1 = in_R8B & 1;
  _Var2 = ggml_are_same_shape(in_RDX,in_RCX);
  if (!_Var2) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x124d,"GGML_ASSERT(%s) failed","ggml_are_same_shape(pw, ph)");
  }
  _Var2 = ggml_is_contiguous((ggml_tensor *)0x152a1f);
  if (!_Var2) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x124e,"GGML_ASSERT(%s) failed","ggml_is_contiguous(a)");
  }
  _Var2 = ggml_is_contiguous((ggml_tensor *)0x152a4e);
  if (!_Var2) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x124f,"GGML_ASSERT(%s) failed","ggml_is_contiguous(pw)");
  }
  _Var2 = ggml_is_contiguous((ggml_tensor *)0x152a7d);
  if (!_Var2) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x1250,"GGML_ASSERT(%s) failed","ggml_is_contiguous(ph)");
  }
  if (in_RCX->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x1251,"GGML_ASSERT(%s) failed","ph->type == GGML_TYPE_F32");
  }
  if (in_RDX->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x1252,"GGML_ASSERT(%s) failed","pw->type == GGML_TYPE_F32");
  }
  if (in_RDX->ne[3] != in_RSI->ne[2]) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x1253,"GGML_ASSERT(%s) failed","pw->ne[3] == a->ne[2]");
  }
  if (in_RDX->ne[0] * in_RDX->ne[0] - in_RSI->ne[0] != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x1254,"GGML_ASSERT(%s) failed","pw->ne[0]*pw->ne[0] == a->ne[0]");
  }
  if (in_RDX->ne[1] * in_RDX->ne[2] - in_RSI->ne[1] != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x1255,"GGML_ASSERT(%s) failed","pw->ne[1]*pw->ne[2] == a->ne[1]");
  }
  if ((bVar1 & 1) == 0) {
    tensor = ggml_dup_tensor(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  else {
    tensor = ggml_view_tensor((ggml_context *)in_RCX,
                              (ggml_tensor *)CONCAT17(bVar1,in_stack_ffffffffffffffd8));
  }
  ggml_set_op_params_i32(tensor,0,(uint)((bVar1 & 1) != 0));
  tensor->op = GGML_OP_ADD_REL_POS;
  tensor->src[0] = in_RSI;
  tensor->src[1] = in_RDX;
  tensor->src[2] = in_RCX;
  return tensor;
}

Assistant:

static struct ggml_tensor * ggml_add_rel_pos_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * pw,
        struct ggml_tensor  * ph,
        bool                  inplace) {
    GGML_ASSERT(ggml_are_same_shape(pw, ph));
    GGML_ASSERT(ggml_is_contiguous(a));
    GGML_ASSERT(ggml_is_contiguous(pw));
    GGML_ASSERT(ggml_is_contiguous(ph));
    GGML_ASSERT(ph->type == GGML_TYPE_F32);
    GGML_ASSERT(pw->type == GGML_TYPE_F32);
    GGML_ASSERT(pw->ne[3] == a->ne[2]);
    GGML_ASSERT(pw->ne[0]*pw->ne[0] == a->ne[0]);
    GGML_ASSERT(pw->ne[1]*pw->ne[2] == a->ne[1]);

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);
    ggml_set_op_params_i32(result, 0, inplace ? 1 : 0);

    result->op     = GGML_OP_ADD_REL_POS;
    result->src[0] = a;
    result->src[1] = pw;
    result->src[2] = ph;

    return result;
}